

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

void WriteStringToFile(FILE *file_ptr,string *str)

{
  ostream *poVar1;
  size_t len;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (file_ptr == (FILE *)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_64.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WriteStringToFile","");
    poVar1 = Logger::Start(ERR,&local_60,0x129,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"file_ptr",8);
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    local_60._M_dataplus._M_p = (pointer)str->_M_string_length;
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      WriteDataToDisk(file_ptr,(char *)&local_60,8);
      WriteDataToDisk(file_ptr,(str->_M_dataplus)._M_p,(size_t)local_60._M_dataplus._M_p);
      return;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_64.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WriteStringToFile","");
    poVar1 = Logger::Start(ERR,&local_60,299,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!str.empty()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

inline void WriteStringToFile(FILE * file_ptr, const std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty string
  CHECK(!str.empty());
  size_t len =str.size();
  // First, write the length of string
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of string
  WriteDataToDisk(file_ptr, const_cast<char *>(str.data()), len);
}